

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O0

void maybe_free_watcher_list(watcher_list *w,uv_loop_t *loop)

{
  uv_loop_t *loop_local;
  watcher_list *w_local;
  
  if ((w->iterating == 0) && (w->watchers == (void **)w->watchers[0])) {
    watcher_root_RB_REMOVE((watcher_root *)&loop->inotify_watchers,w);
    inotify_rm_watch(loop->inotify_fd,w->wd);
    uv__free(w);
  }
  return;
}

Assistant:

static void maybe_free_watcher_list(struct watcher_list* w, uv_loop_t* loop) {
  /* if the watcher_list->watchers is being iterated over, we can't free it. */
  if ((!w->iterating) && QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&loop->inotify_watchers), w);
    inotify_rm_watch(loop->inotify_fd, w->wd);
    uv__free(w);
  }
}